

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          first,__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                last)

{
  bool bVar1;
  Detail *pDVar2;
  ReusableStringStream *this_00;
  vector<int,_std::allocator<int>_> *e;
  vector<int,_std::allocator<int>_> *e_00;
  string local_88;
  string local_68;
  undefined1 local_38 [8];
  ReusableStringStream rss;
  __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  last_local;
  __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  first_local;
  
  rss.m_oss = (ostream *)first._M_current;
  last_local._M_current = (vector<int,_std::allocator<int>_> *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_38);
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(char (*) [3])"{ ");
  bVar1 = __gnu_cxx::operator!=
                    (&last_local,
                     (__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                      *)&rss.m_oss);
  if (bVar1) {
    pDVar2 = (Detail *)
             __gnu_cxx::
             __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator*(&last_local);
    stringify<std::vector<int,std::allocator<int>>>(&local_68,pDVar2,e);
    ReusableStringStream::operator<<((ReusableStringStream *)local_38,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    __gnu_cxx::
    __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&last_local);
    while (bVar1 = __gnu_cxx::operator!=
                             (&last_local,
                              (__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&rss.m_oss), bVar1) {
      this_00 = ReusableStringStream::operator<<
                          ((ReusableStringStream *)local_38,(char (*) [3])", ");
      pDVar2 = (Detail *)
               __gnu_cxx::
               __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator*(&last_local);
      stringify<std::vector<int,std::allocator<int>>>(&local_88,pDVar2,e_00);
      ReusableStringStream::operator<<(this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      __gnu_cxx::
      __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(&last_local);
    }
  }
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(char (*) [3])" }");
  ReusableStringStream::str_abi_cxx11_
            ((string *)__return_storage_ptr__,(ReusableStringStream *)local_38);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }